

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

uint GetSplitCopyCount(VmInstruction *inst,uint marker)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstruction *pVVar4;
  VmInstruction *pVVar5;
  VmInstruction *source_1;
  VmInstruction *destination_1;
  uint argumentPos_1;
  VmInstruction *instruction_3;
  uint userPos_1;
  VmInstruction *source;
  VmInstruction *destination;
  uint argumentPos;
  VmInstruction *instruction_2;
  uint userPos;
  VmInstruction *instruction_1;
  VmInstruction *instruction;
  uint local_20;
  uint argument;
  uint count;
  uint marker_local;
  VmInstruction *inst_local;
  
  if (inst->regVmSearchMarker == marker) {
    inst_local._4_4_ = 0;
  }
  else {
    inst->regVmSearchMarker = marker;
    local_20 = 0;
    if (inst->cmd == VM_INST_PHI) {
      for (instruction._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&inst->arguments),
          instruction._4_4_ < uVar1; instruction._4_4_ = instruction._4_4_ + 2) {
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,instruction._4_4_);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        uVar1 = GetSplitCopyCount(pVVar3,marker);
        local_20 = uVar1 + local_20;
      }
    }
    if (inst->cmd == VM_INST_MOV) {
      ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      if ((inst->color != 0) && (inst->color == pVVar3->color)) {
        local_20 = local_20 + 1;
      }
    }
    if (inst->cmd == VM_INST_DEF) {
      for (instruction_2._4_4_ = 0;
          uVar1 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
          instruction_2._4_4_ < uVar1; instruction_2._4_4_ = instruction_2._4_4_ + 1) {
        ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                            (&(inst->super_VmValue).users,instruction_2._4_4_);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        if ((pVVar3 != (VmInstruction *)0x0) && (pVVar3->cmd == VM_INST_PARALLEL_COPY)) {
          for (destination._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
              destination._4_4_ < uVar1; destination._4_4_ = destination._4_4_ + 2) {
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination._4_4_);
            pVVar4 = getType<VmInstruction>(*ppVVar2);
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                                (&pVVar3->arguments,destination._4_4_ + 1);
            pVVar5 = getType<VmInstruction>(*ppVVar2);
            if (pVVar4 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c93,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if (pVVar5 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c94,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if (((inst == pVVar4) && (inst->color != 0)) && (inst->color == pVVar5->color)) {
              local_20 = local_20 + 1;
            }
          }
        }
      }
    }
    for (instruction_3._4_4_ = 0;
        uVar1 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
        instruction_3._4_4_ < uVar1; instruction_3._4_4_ = instruction_3._4_4_ + 1) {
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                          (&(inst->super_VmValue).users,instruction_3._4_4_);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      if (pVVar3->cmd == VM_INST_PHI) {
        uVar1 = GetSplitCopyCount(pVVar3,marker);
        local_20 = uVar1 + local_20;
      }
      if (pVVar3->cmd == VM_INST_MOV) {
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,0);
        if (inst != (VmInstruction *)*ppVVar2) {
          __assert_fail("inst == instruction->arguments[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1ca9,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
        }
        if ((pVVar3->color != 0) && (pVVar3->color == inst->color)) {
          local_20 = local_20 + 1;
        }
      }
      if (pVVar3->cmd == VM_INST_PARALLEL_COPY) {
        for (destination_1._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
            destination_1._4_4_ < uVar1; destination_1._4_4_ = destination_1._4_4_ + 2) {
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination_1._4_4_);
          pVVar4 = getType<VmInstruction>(*ppVVar2);
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                              (&pVVar3->arguments,destination_1._4_4_ + 1);
          pVVar5 = getType<VmInstruction>(*ppVVar2);
          if (pVVar4 == (VmInstruction *)0x0) {
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1cb6,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
          }
          if (pVVar5 == (VmInstruction *)0x0) {
            __assert_fail("source",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1cb7,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
          }
          if (((inst == pVVar5) && (pVVar3->color != 0)) && (pVVar3->color == pVVar4->color)) {
            local_20 = local_20 + 1;
          }
        }
      }
    }
    inst_local._4_4_ = local_20;
  }
  return inst_local._4_4_;
}

Assistant:

unsigned GetSplitCopyCount(VmInstruction *inst, unsigned marker)
{
	if(inst->regVmSearchMarker == marker)
		return 0;

	inst->regVmSearchMarker = marker;

	unsigned count = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			count += GetSplitCopyCount(instruction, marker);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		if(inst->color != 0 && inst->color == instruction->color)
			count++;
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
					{
						if(inst->color != 0 && inst->color == source->color)
							count++;
					}
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			count += GetSplitCopyCount(instruction, marker);

		if(instruction->cmd == VM_INST_MOV)
		{
			assert(inst == instruction->arguments[0]);

			if(instruction->color != 0 && instruction->color == inst->color)
				count++;
		}

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
				{
					if(instruction->color != 0 && instruction->color == destination->color)
						count++;
				}
			}
		}
	}

	return count;
}